

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsOF.c
# Opt level: O0

void JsObjectProtoHasOwnPropertyCall
               (JsObject *obj,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  char *local_50;
  char *prop;
  JsValue v;
  JsValue *res_local;
  JsValue **argv_local;
  int argc_local;
  JsObject *thisobj_local;
  JsObject *obj_local;
  
  local_50 = "undefined";
  v.u.reference.name = (char *)res;
  if (0 < argc) {
    JsToString(*argv,(JsValue *)&prop);
    (*thisobj->HasOwnProperty)(thisobj,(char *)v._0_8_,(JsValue *)v.u.reference.name);
    local_50 = (char *)v._0_8_;
  }
  (*thisobj->HasOwnProperty)(thisobj,local_50,(JsValue *)v.u.reference.name);
  return;
}

Assistant:

static void JsObjectProtoHasOwnPropertyCall(struct JsObject *obj, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
	struct JsValue v;
	char* prop = "undefined";
	
	if(argc >0 ){
		JsToString(argv[0],&v);
		(*thisobj->HasOwnProperty)(thisobj,v.u.string,res);
		prop = v.u.string;
	}
	(*thisobj->HasOwnProperty)(thisobj,prop,res);
}